

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddAPPPacket
          (RTCPCompoundPacketBuilder *this,uint8_t subtype,uint32_t ssrc,uint8_t *name,void *appdata
          ,size_t appdatalen)

{
  size_t sVar1;
  size_t sVar2;
  size_t numbytes;
  uint16_t uVar3;
  RTCPCommonHeader RVar4;
  size_t sVar5;
  size_t sVar6;
  RTPMemoryManager *mgr;
  Buffer local_78;
  RTCPCommonHeader *local_68;
  uint32_t *source;
  RTCPCommonHeader *hdr;
  uint8_t *buf;
  size_t totalotherbytes;
  size_t packsize;
  size_t appdatawords;
  size_t appdatalen_local;
  void *appdata_local;
  uint8_t *name_local;
  uint32_t ssrc_local;
  uint8_t subtype_local;
  RTCPCompoundPacketBuilder *this_local;
  
  if ((this->arebuilding & 1U) == 0) {
    this_local._4_4_ = -0x2a;
  }
  else if (subtype < 0x20) {
    if ((appdatalen & 3) == 0) {
      packsize = appdatalen >> 2;
      if (packsize + 2 < 0x10000) {
        totalotherbytes = appdatalen + 0xc;
        sVar1 = this->appsize;
        sVar2 = this->byesize;
        appdatawords = appdatalen;
        appdatalen_local = (size_t)appdata;
        appdata_local = name;
        name_local._0_4_ = ssrc;
        name_local._7_1_ = subtype;
        _ssrc_local = this;
        sVar5 = SDES::NeededBytes(&this->sdes);
        sVar6 = Report::NeededBytes(&this->report);
        numbytes = totalotherbytes;
        buf = (uint8_t *)(sVar1 + sVar2 + sVar5 + sVar6);
        if ((uint8_t *)this->maximumpacketsize < buf + totalotherbytes) {
          this_local._4_4_ = -0x2b;
        }
        else {
          mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          source = (uint32_t *)operator_new__(numbytes,mgr,3);
          if ((RTCPCommonHeader *)source == (RTCPCommonHeader *)0x0) {
            this_local._4_4_ = -1;
          }
          else {
            *(byte *)source = *(byte *)source & 0x3f | 0x80;
            *(byte *)source = *(byte *)source & 0xdf;
            *(byte *)source = *(byte *)source & 0xe0 | name_local._7_1_ & 0x1f;
            hdr = (RTCPCommonHeader *)source;
            uVar3 = htons((short)packsize + 2);
            *(uint16_t *)((long)source + 2) = uVar3;
            *(undefined1 *)((long)source + 1) = 0xcc;
            local_68 = hdr + 1;
            RVar4 = (RTCPCommonHeader)htonl((uint32_t)name_local);
            *local_68 = RVar4;
            *(undefined1 *)(hdr + 2) = *appdata_local;
            hdr[2].packettype = *(uint8_t *)((long)appdata_local + 1);
            *(undefined1 *)&hdr[2].length = *(undefined1 *)((long)appdata_local + 2);
            *(undefined1 *)((long)&hdr[2].length + 1) = *(undefined1 *)((long)appdata_local + 3);
            if (appdatawords != 0) {
              memcpy(hdr + 3,(void *)appdatalen_local,appdatawords);
            }
            Buffer::Buffer(&local_78,(uint8_t *)hdr,totalotherbytes);
            std::__cxx11::
            list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
            ::push_back(&this->apppackets,&local_78);
            this->appsize = totalotherbytes + this->appsize;
            this_local._4_4_ = 0;
          }
        }
      }
      else {
        this_local._4_4_ = -0x22;
      }
    }
    else {
      this_local._4_4_ = -0x24;
    }
  }
  else {
    this_local._4_4_ = -0x25;
  }
  return this_local._4_4_;
}

Assistant:

int RTCPCompoundPacketBuilder::AddAPPPacket(uint8_t subtype,uint32_t ssrc,const uint8_t name[4],const void *appdata,size_t appdatalen)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;
	if (subtype > 31)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ILLEGALSUBTYPE;
	if ((appdatalen%4) != 0)
		return ERR_RTP_RTCPCOMPPACKBUILDER_ILLEGALAPPDATALENGTH;

	size_t appdatawords = appdatalen/4;

	if ((appdatawords+2) > 65535)
		return ERR_RTP_RTCPCOMPPACKBUILDER_APPDATALENTOOBIG;
	
	size_t packsize = sizeof(RTCPCommonHeader)+sizeof(uint32_t)*2+appdatalen;
#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalotherbytes = appsize+byesize+sdes.NeededBytes()+report.NeededBytes();
#else
	size_t totalotherbytes = appsize+unknownsize+byesize+sdes.NeededBytes()+report.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 

	if ((totalotherbytes + packsize) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	uint8_t *buf;
	
	buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPAPPPACKET) uint8_t[packsize];
	if (buf == 0)
		return ERR_RTP_OUTOFMEM;

	RTCPCommonHeader *hdr = (RTCPCommonHeader *)buf;

	hdr->version = 2;
	hdr->padding = 0;
	hdr->count = subtype;
	
	hdr->length = htons((uint16_t)(appdatawords+2));
	hdr->packettype = RTP_RTCPTYPE_APP;
	
	uint32_t *source = (uint32_t *)(buf+sizeof(RTCPCommonHeader));
	*source = htonl(ssrc);

	buf[sizeof(RTCPCommonHeader)+sizeof(uint32_t)+0] = name[0];
	buf[sizeof(RTCPCommonHeader)+sizeof(uint32_t)+1] = name[1];
	buf[sizeof(RTCPCommonHeader)+sizeof(uint32_t)+2] = name[2];
	buf[sizeof(RTCPCommonHeader)+sizeof(uint32_t)+3] = name[3];

	if (appdatalen > 0)
		memcpy((buf+sizeof(RTCPCommonHeader)+sizeof(uint32_t)*2),appdata,appdatalen);

	apppackets.push_back(Buffer(buf,packsize));
	appsize += packsize;
	
	return 0;
}